

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O1

int x509_date_is_valid(mbedtls_x509_time *t)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  uVar1 = t->year;
  iVar3 = -0x2400;
  if ((((uVar1 < 10000) && ((uint)t->hour < 0x18)) && ((uint)t->min < 0x3c)) &&
     (((uint)t->sec < 0x3c && (uVar2 = t->mon, uVar2 < 0xd)))) {
    iVar4 = 0x1f;
    if ((0x15aaU >> (uVar2 & 0x1f) & 1) == 0) {
      if ((0xa50U >> (uVar2 & 0x1f) & 1) == 0) {
        if (uVar2 != 2) {
          return -0x2400;
        }
        if (((uVar1 & 3) != 0) || (iVar4 = 0x1d, uVar1 == (uVar1 / 100) * 100)) {
          iVar4 = ((uVar1 * -0x3d70a3d7 >> 4 | uVar1 * -0x70000000) < 0xa3d70b) + 0x1c;
        }
      }
      else {
        iVar4 = 0x1e;
      }
    }
    iVar3 = 0;
    if (iVar4 < t->day) {
      iVar3 = -0x2400;
    }
    if (t->day < 1) {
      iVar3 = -0x2400;
    }
  }
  return iVar3;
}

Assistant:

static int x509_date_is_valid(const mbedtls_x509_time *t )
{
    int ret = MBEDTLS_ERR_X509_INVALID_DATE;
    int month_len;

    CHECK_RANGE( 0, 9999, t->year );
    CHECK_RANGE( 0, 23,   t->hour );
    CHECK_RANGE( 0, 59,   t->min  );
    CHECK_RANGE( 0, 59,   t->sec  );

    switch( t->mon )
    {
        case 1: case 3: case 5: case 7: case 8: case 10: case 12:
            month_len = 31;
            break;
        case 4: case 6: case 9: case 11:
            month_len = 30;
            break;
        case 2:
            if( ( !( t->year % 4 ) && t->year % 100 ) ||
                !( t->year % 400 ) )
                month_len = 29;
            else
                month_len = 28;
            break;
        default:
            return( ret );
    }
    CHECK_RANGE( 1, month_len, t->day );

    return( 0 );
}